

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void cfd::core::ConfidentialAssetId::CheckVersion(uint8_t version)

{
  CfdException *this;
  uint uVar1;
  undefined7 in_register_00000039;
  uint8_t version_local;
  allocator local_39;
  undefined1 local_38 [32];
  
  uVar1 = (uint)CONCAT71(in_register_00000039,version);
  if ((uVar1 < 0xc) && ((0xc03U >> (uVar1 & 0x1f) & 1) != 0)) {
    return;
  }
  local_38._0_8_ = "cfdcore_elements_transaction.cpp";
  local_38._8_4_ = 0x1b5;
  local_38._16_8_ = "CheckVersion";
  version_local = version;
  logger::warn<unsigned_char&>
            ((CfdSourceLocation *)local_38,"Asset version Invalid. version={}.",&version_local);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_38,"Asset version Invalid.",&local_39);
  CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_38);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialAssetId::CheckVersion(uint8_t version) {
  if ((version != 0) && (version != 1) && (version != 0x0a) &&
      (version != 0x0b)) {
    warn(CFD_LOG_SOURCE, "Asset version Invalid. version={}.", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Asset version Invalid.");
  }
}